

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall wabt::interp::Memory::Grow(Memory *this,u64 count)

{
  bool bVar1;
  u64 local_28;
  u64 new_pages;
  u64 count_local;
  Memory *this_local;
  
  new_pages = count;
  count_local = (u64)this;
  bVar1 = CanGrow<unsigned_long>(&(this->type_).limits,this->pages_,count,&local_28);
  if (bVar1) {
    this->pages_ = local_28;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->data_,local_28 << 0x10);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::Grow(u64 count) {
  u64 new_pages;
  if (CanGrow<u64>(type_.limits, pages_, count, &new_pages)) {
#if WABT_BIG_ENDIAN
    auto old_size = data_.size();
#endif
    pages_ = new_pages;
    data_.resize(new_pages * WABT_PAGE_SIZE);
#if WABT_BIG_ENDIAN
    std::move_backward(data_.begin(), data_.begin() + old_size, data_.end());
    std::fill(data_.begin(), data_.end() - old_size, 0);
#endif
    return Result::Ok;
  }
  return Result::Error;
}